

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

void cmSystemTools::GlobDirs
               (string *path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_00;
  int iVar1;
  long lVar2;
  Status SVar3;
  unsigned_long uVar4;
  char *pcVar5;
  uint uVar6;
  ulong dindex;
  bool bVar7;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  Directory d;
  string fname;
  string startPath;
  string finishPath;
  allocator<char> local_141;
  Directory local_140;
  string local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_118;
  string local_110;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_f0;
  undefined8 local_d8;
  undefined1 *local_d0;
  undefined8 local_c8;
  size_t local_c0;
  char *local_b8;
  undefined8 local_b0;
  long *local_a8 [2];
  long local_98 [2];
  long *local_88 [2];
  long local_78 [2];
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  lVar2 = std::__cxx11::string::find((char *)path,0x24b17a,0);
  if (lVar2 == -1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(files,path);
    return;
  }
  std::__cxx11::string::substr((ulong)&local_110,(ulong)path);
  std::__cxx11::string::substr((ulong)local_a8,(ulong)path);
  cmsys::Directory::Directory(&local_140);
  SVar3 = cmsys::Directory::Load(&local_140,&local_110,(string *)0x0);
  if (SVar3.Kind_ == Success) {
    uVar6 = 0;
    local_118 = files;
    while( true ) {
      uVar4 = cmsys::Directory::GetNumberOfFiles(&local_140);
      dindex = (ulong)uVar6;
      if (uVar4 <= dindex) break;
      pcVar5 = cmsys::Directory::GetFile(&local_140,dindex);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,pcVar5,(allocator<char> *)&local_68);
      iVar1 = std::__cxx11::string::compare((char *)&local_f0);
      if (iVar1 == 0) {
        bVar7 = false;
      }
      else {
        pcVar5 = cmsys::Directory::GetFile(&local_140,dindex);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_88,pcVar5,&local_141);
        iVar1 = std::__cxx11::string::compare((char *)local_88);
        bVar7 = iVar1 != 0;
        if (local_88[0] != local_78) {
          operator_delete(local_88[0],local_78[0] + 1);
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
          local_f0.first._M_len != &local_f0.second) {
        operator_delete((void *)local_f0.first._M_len,
                        (ulong)((long)&((local_f0.second)->_M_dataplus)._M_p + 1));
      }
      files_00 = local_118;
      if (bVar7) {
        pcVar5 = cmsys::Directory::GetFile(&local_140,dindex);
        local_f0.first._M_len = local_110._M_string_length;
        local_f0.first._M_str = local_110._M_dataplus._M_p;
        local_f0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_68 = 0;
        local_60 = 1;
        local_d0 = local_50;
        local_50[0] = 0x2f;
        local_d8 = 1;
        local_c8 = 0;
        local_58 = local_d0;
        local_c0 = strlen(pcVar5);
        local_b0 = 0;
        views._M_len = 3;
        views._M_array = &local_f0;
        local_b8 = pcVar5;
        cmCatViews(&local_138,views);
        bVar7 = cmsys::SystemTools::FileIsDirectory(&local_138);
        if (bVar7) {
          std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_a8[0]);
          GlobDirs(&local_138,files_00);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
      }
      uVar6 = uVar6 + 1;
    }
  }
  cmsys::Directory::~Directory(&local_140);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmSystemTools::GlobDirs(const std::string& path,
                             std::vector<std::string>& files)
{
  std::string::size_type pos = path.find("/*");
  if (pos == std::string::npos) {
    files.push_back(path);
    return;
  }
  std::string startPath = path.substr(0, pos);
  std::string finishPath = path.substr(pos + 2);

  cmsys::Directory d;
  if (d.Load(startPath)) {
    for (unsigned int i = 0; i < d.GetNumberOfFiles(); ++i) {
      if ((std::string(d.GetFile(i)) != ".") &&
          (std::string(d.GetFile(i)) != "..")) {
        std::string fname = cmStrCat(startPath, '/', d.GetFile(i));
        if (cmSystemTools::FileIsDirectory(fname)) {
          fname += finishPath;
          cmSystemTools::GlobDirs(fname, files);
        }
      }
    }
  }
}